

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnCodeMetadataCount
          (BinaryReaderIR *this,Index function_index,Index count)

{
  BinaryReaderIR *this_00;
  Func *pFVar1;
  _Map_pointer __src;
  ulong uVar2;
  _Map_pointer ppEVar3;
  Entry *pEVar4;
  _Elt_pointer pEVar5;
  size_t sVar6;
  long lVar7;
  _Map_pointer ppEVar8;
  long lVar9;
  _Map_pointer __dest;
  
  pEVar5 = (this->code_metadata_queue_).entries.
           super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  pFVar1 = (this->module_->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
           _M_impl.super__Vector_impl_data._M_start[function_index];
  if (pEVar5 != (this->code_metadata_queue_).entries.
                super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    pEVar5->func = pFVar1;
    (pEVar5->func_queue).
    super__Deque_base<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>,_std::allocator<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    (pEVar5->func_queue).
    super__Deque_base<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>,_std::allocator<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map_size = 0;
    (pEVar5->func_queue).
    super__Deque_base<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>,_std::allocator<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>_>_>
    ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    (pEVar5->func_queue).
    super__Deque_base<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>,_std::allocator<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>_>_>
    ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
    (pEVar5->func_queue).
    super__Deque_base<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>,_std::allocator<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>_>_>
    ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
    (pEVar5->func_queue).
    super__Deque_base<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>,_std::allocator<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>_>_>
    ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
    (pEVar5->func_queue).
    super__Deque_base<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>,_std::allocator<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>_>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
    (pEVar5->func_queue).
    super__Deque_base<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>,_std::allocator<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>_>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
    (pEVar5->func_queue).
    super__Deque_base<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>,_std::allocator<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>_>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
    (pEVar5->func_queue).
    super__Deque_base<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>,_std::allocator<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>_>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
    std::
    _Deque_base<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>,_std::allocator<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>_>_>
    ::_M_initialize_map(&(pEVar5->func_queue).
                         super__Deque_base<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>,_std::allocator<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>_>_>
                        ,0);
    pEVar5 = (this->code_metadata_queue_).entries.
             super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
    goto LAB_0013bbde;
  }
  ppEVar8 = (this->code_metadata_queue_).entries.
            super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  __src = (this->code_metadata_queue_).entries.
          super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
          ._M_impl.super__Deque_impl_data._M_start._M_node;
  lVar9 = (long)ppEVar8 - (long)__src >> 3;
  if (((long)(this->code_metadata_queue_).entries.
             super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last -
       (long)(this->code_metadata_queue_).entries.
             super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) * 0x2e8ba2e8ba2e8ba3 +
      ((long)pEVar5 -
       (long)(this->code_metadata_queue_).entries.
             super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) * 0x2e8ba2e8ba2e8ba3 +
      (lVar9 + -1 + (ulong)(ppEVar8 == (_Map_pointer)0x0)) * 5 == 0x1745d1745d1745d) {
LAB_0013bbfb:
    std::__throw_length_error("cannot create std::deque larger than max_size()");
  }
  ppEVar3 = (this->code_metadata_queue_).entries.
            super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
            ._M_impl.super__Deque_impl_data._M_map;
  uVar2 = (this->code_metadata_queue_).entries.
          super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
          ._M_impl.super__Deque_impl_data._M_map_size;
  if (uVar2 - ((long)ppEVar8 - (long)ppEVar3 >> 3) < 2) {
    if (lVar9 * 2 + 4U < uVar2) {
      __dest = (_Map_pointer)((long)ppEVar3 + (uVar2 - (lVar9 + 2) & 0xfffffffffffffffe) * 4);
      if (__dest < __src) {
        sVar6 = (long)ppEVar8 + (8 - (long)__src);
        ppEVar8 = __dest;
        if (sVar6 != 0) {
LAB_0013bb36:
          memmove(ppEVar8,__src,sVar6);
        }
      }
      else {
        sVar6 = (long)ppEVar8 + (8 - (long)__src);
        if (sVar6 != 0) {
          ppEVar8 = (_Map_pointer)((long)__dest + ((lVar9 + 1) * 8 - sVar6));
          goto LAB_0013bb36;
        }
      }
    }
    else {
      lVar7 = uVar2 * 2 + (ulong)(uVar2 == 0);
      this_00 = (BinaryReaderIR *)(lVar7 + 2);
      if ((ulong)this_00 >> 0x3c != 0) {
        _GLOBAL__N_1::BinaryReaderIR::OnCodeMetadataCount(this_00);
        goto LAB_0013bbfb;
      }
      ppEVar3 = (_Map_pointer)operator_new((long)this_00 * 8);
      __dest = (_Map_pointer)((long)ppEVar3 + (lVar7 - lVar9 & 0xfffffffffffffffeU) * 4);
      ppEVar8 = (this->code_metadata_queue_).entries.
                super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node;
      sVar6 = (long)(this->code_metadata_queue_).entries.
                    super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node + (8 - (long)ppEVar8);
      if (sVar6 != 0) {
        memmove(__dest,ppEVar8,sVar6);
      }
      operator_delete((this->code_metadata_queue_).entries.
                      super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
                      ._M_impl.super__Deque_impl_data._M_map,
                      (this->code_metadata_queue_).entries.
                      super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
                      ._M_impl.super__Deque_impl_data._M_map_size << 3);
      (this->code_metadata_queue_).entries.
      super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
      ._M_impl.super__Deque_impl_data._M_map = ppEVar3;
      (this->code_metadata_queue_).entries.
      super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
      ._M_impl.super__Deque_impl_data._M_map_size = (size_t)this_00;
    }
    (this->code_metadata_queue_).entries.
    super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
    ._M_impl.super__Deque_impl_data._M_start._M_node = __dest;
    pEVar4 = *__dest;
    (this->code_metadata_queue_).entries.
    super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
    ._M_impl.super__Deque_impl_data._M_start._M_first = pEVar4;
    (this->code_metadata_queue_).entries.
    super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
    ._M_impl.super__Deque_impl_data._M_start._M_last = pEVar4 + 5;
    (this->code_metadata_queue_).entries.
    super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_node = __dest + lVar9;
    pEVar4 = __dest[lVar9];
    (this->code_metadata_queue_).entries.
    super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_first = pEVar4;
    (this->code_metadata_queue_).entries.
    super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_last = pEVar4 + 5;
  }
  pEVar4 = (Entry *)operator_new(0x1b8);
  (this->code_metadata_queue_).entries.
  super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node[1] = pEVar4;
  pEVar5 = (this->code_metadata_queue_).entries.
           super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  pEVar5->func = pFVar1;
  (pEVar5->func_queue).
  super__Deque_base<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>,_std::allocator<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (pEVar5->func_queue).
  super__Deque_base<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>,_std::allocator<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (pEVar5->func_queue).
  super__Deque_base<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>,_std::allocator<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (pEVar5->func_queue).
  super__Deque_base<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>,_std::allocator<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (pEVar5->func_queue).
  super__Deque_base<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>,_std::allocator<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (pEVar5->func_queue).
  super__Deque_base<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>,_std::allocator<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (pEVar5->func_queue).
  super__Deque_base<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>,_std::allocator<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (pEVar5->func_queue).
  super__Deque_base<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>,_std::allocator<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (pEVar5->func_queue).
  super__Deque_base<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>,_std::allocator<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (pEVar5->func_queue).
  super__Deque_base<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>,_std::allocator<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>,_std::allocator<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>_>_>
  ::_M_initialize_map(&(pEVar5->func_queue).
                       super__Deque_base<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>,_std::allocator<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>_>_>
                      ,0);
  ppEVar8 = (this->code_metadata_queue_).entries.
            super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  (this->code_metadata_queue_).entries.
  super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = ppEVar8 + 1;
  pEVar5 = ppEVar8[1];
  (this->code_metadata_queue_).entries.
  super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = pEVar5;
  (this->code_metadata_queue_).entries.
  super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = pEVar5 + 5;
LAB_0013bbde:
  (this->code_metadata_queue_).entries.
  super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = pEVar5;
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnCodeMetadataCount(Index function_index, Index count) {
  code_metadata_queue_.push_func(module_->funcs[function_index]);
  return Result::Ok;
}